

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O2

void __thiscall
pstore::serialize::archive::
range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::get<int>(range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *this,int *v)

{
  uchar *puVar1;
  long lVar2;
  uint8_t *ptr;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    puVar1 = (this->first_)._M_current;
    (this->first_)._M_current = puVar1 + 1;
    *(uchar *)((long)v + lVar2) = *puVar1;
  }
  return;
}

Assistant:

void get (Ty & v) {
                    static_assert (std::is_standard_layout<Ty>::value,
                                   "range_reader can only read standard-layout types");
                    auto ptr = reinterpret_cast<std::uint8_t *> (&v);
                    auto const last = ptr + sizeof (Ty);
                    while (ptr != last) {
                        *(ptr++) = *(first_++);
                    }
                }